

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

void __thiscall
cmGlobalGenerator::FillExtensionToLanguageMap(cmGlobalGenerator *this,string *l,cmMakefile *mf)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  init;
  bool bVar1;
  string *psVar2;
  reference __k;
  mapped_type *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_e8;
  string *i;
  iterator __end1;
  iterator __begin1;
  cmList *__range1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  iterator local_80;
  size_type local_78;
  undefined1 local_70 [8];
  cmList extensionList;
  string *exts;
  string extensionsVar;
  cmMakefile *mf_local;
  string *l_local;
  cmGlobalGenerator *this_local;
  
  extensionsVar.field_2._8_8_ = mf;
  cmStrCat<char_const(&)[7],std::__cxx11::string_const&,char_const(&)[24]>
            ((string *)&exts,(char (*) [7])0x1244722,l,(char (*) [24])"_SOURCE_FILE_EXTENSIONS");
  psVar2 = cmMakefile::GetSafeDefinition((cmMakefile *)extensionsVar.field_2._8_8_,(string *)&exts);
  std::__cxx11::string::string((string *)&local_a0,(string *)psVar2);
  local_80 = &local_a0;
  local_78 = 1;
  init._M_len = 1;
  init._M_array = local_80;
  cmList::cmList((cmList *)local_70,init);
  local_e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_80;
  do {
    local_e8 = local_e8 + -1;
    std::__cxx11::string::~string((string *)local_e8);
  } while (local_e8 != &local_a0);
  __end1 = cmList::begin_abi_cxx11_((cmList *)local_70);
  i = (string *)cmList::end_abi_cxx11_((cmList *)local_70);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&i);
    if (!bVar1) break;
    __k = __gnu_cxx::
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator*(&__end1);
    this_00 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&this->ExtensionToLanguage,__k);
    std::__cxx11::string::operator=((string *)this_00,(string *)l);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  cmList::~cmList((cmList *)local_70);
  std::__cxx11::string::~string((string *)&exts);
  return;
}

Assistant:

void cmGlobalGenerator::FillExtensionToLanguageMap(const std::string& l,
                                                   cmMakefile* mf)
{
  std::string extensionsVar = cmStrCat("CMAKE_", l, "_SOURCE_FILE_EXTENSIONS");
  const std::string& exts = mf->GetSafeDefinition(extensionsVar);
  cmList extensionList{ exts };
  for (std::string const& i : extensionList) {
    this->ExtensionToLanguage[i] = l;
  }
}